

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Container.cpp
# Opt level: O0

bool __thiscall
database::Container::_IsValidFilterCriteriaForRawSelection
          (Container *this,impl_filter_type *filter_criteria)

{
  bool bVar1;
  reference ppVar2;
  _Self local_90 [3];
  _Self local_78;
  undefined1 local_70 [8];
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<database::ComparableString,_database::ComparisonType>,_std::allocator<std::pair<database::ComparableString,_database::ComparisonType>_>_>_>
  pair;
  const_iterator __end1;
  const_iterator __begin1;
  impl_filter_type *__range1;
  impl_filter_type *filter_criteria_local;
  Container *this_local;
  
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<database::ComparableString,_database::ComparisonType>,_std::allocator<std::pair<database::ComparableString,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<database::ComparableString,_database::ComparisonType>,_std::allocator<std::pair<database::ComparableString,_database::ComparisonType>_>_>_>_>_>
           ::begin(filter_criteria);
  pair.second.
  super__Vector_base<std::pair<database::ComparableString,_database::ComparisonType>,_std::allocator<std::pair<database::ComparableString,_database::ComparisonType>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<database::ComparableString,_database::ComparisonType>,_std::allocator<std::pair<database::ComparableString,_database::ComparisonType>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<database::ComparableString,_database::ComparisonType>,_std::allocator<std::pair<database::ComparableString,_database::ComparisonType>_>_>_>_>_>
                ::end(filter_criteria);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&pair.second.
                                                                                                      
                                                  super__Vector_base<std::pair<database::ComparableString,_database::ComparisonType>,_std::allocator<std::pair<database::ComparableString,_database::ComparisonType>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                ), bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<database::ComparableString,_database::ComparisonType>,_std::allocator<std::pair<database::ComparableString,_database::ComparisonType>_>_>_>_>
             ::operator*(&__end1);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<database::ComparableString,_database::ComparisonType>,_std::allocator<std::pair<database::ComparableString,_database::ComparisonType>_>_>_>
    ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<database::ComparableString,_database::ComparisonType>,_std::allocator<std::pair<database::ComparableString,_database::ComparisonType>_>_>_>
            *)local_70,ppVar2);
    local_78._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>_>_>
         ::find(&this->m_schema,(key_type *)local_70);
    local_90[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_database::DataType>_>_>
         ::end(&this->m_schema);
    bVar1 = std::operator==(&local_78,local_90);
    if (bVar1) {
      this_local._7_1_ = 0;
    }
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<database::ComparableString,_database::ComparisonType>,_std::allocator<std::pair<database::ComparableString,_database::ComparisonType>_>_>_>
    ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<database::ComparableString,_database::ComparisonType>,_std::allocator<std::pair<database::ComparableString,_database::ComparisonType>_>_>_>
             *)local_70);
    if (bVar1) goto LAB_002016b6;
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::pair<database::ComparableString,_database::ComparisonType>,_std::allocator<std::pair<database::ComparableString,_database::ComparisonType>_>_>_>_>
    ::operator++(&__end1);
  }
  this_local._7_1_ = 1;
LAB_002016b6:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool database::Container::_IsValidFilterCriteriaForRawSelection(const database::impl_filter_type& filter_criteria) const
{
  for(auto pair: filter_criteria)
    if(m_schema.find(pair.first) == m_schema.end())
      return false;
  return true;
}